

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev.c
# Opt level: O3

void periodic_recalc(ev_loop *loop,ev_periodic *w)

{
  ANPENDING *pAVar1;
  double dVar2;
  bool bVar3;
  bool bVar4;
  W *in_XMM0_Qa;
  double dVar5;
  W *ppeVar6;
  W *ppeVar7;
  W *ppeVar8;
  ANPENDING *pAVar9;
  
  pAVar1 = loop->pendings[0];
  pAVar9 = pAVar1;
  if ((double)pAVar1 <= 0.0001220703125) {
    pAVar9 = (ANPENDING *)0x3f20000000000000;
  }
  dVar2 = *(double *)&loop->rfeedmax;
  dVar5 = floor(((double)in_XMM0_Qa - dVar2) / (double)pAVar9);
  ppeVar6 = (W *)(dVar5 * (double)pAVar9 + dVar2);
  do {
    ppeVar7 = ppeVar6;
    if ((double)in_XMM0_Qa < (double)ppeVar6) break;
    ppeVar8 = (W *)((double)pAVar1 + (double)ppeVar6);
    bVar3 = NAN((double)ppeVar6);
    bVar4 = (double)ppeVar8 != (double)ppeVar6;
    ppeVar6 = ppeVar8;
  } while ((bVar4) || (ppeVar7 = in_XMM0_Qa, NAN((double)ppeVar8) || bVar3));
  loop->rfeeds = ppeVar7;
  return;
}

Assistant:

static void noinline
periodic_recalc (EV_P_ ev_periodic *w)
{
  ev_tstamp interval = w->interval > MIN_INTERVAL ? w->interval : MIN_INTERVAL;
  ev_tstamp at = w->offset + interval * ev_floor ((ev_rt_now - w->offset) / interval);

  /* the above almost always errs on the low side */
  while (at <= ev_rt_now)
    {
      ev_tstamp nat = at + w->interval;

      /* when resolution fails us, we use ev_rt_now */
      if (expect_false (nat == at))
        {
          at = ev_rt_now;
          break;
        }

      at = nat;
    }

  ev_at (w) = at;
}